

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O1

void sortAndUnique(word **a,Abc_TtStore_t *p)

{
  int iVar1;
  word *__s1;
  int iVar2;
  int iVar3;
  word *__s2;
  size_t __nmemb;
  size_t sVar4;
  
  __nmemb = (size_t)p->nFuncs;
  qsort(a,__nmemb,8,compareWords3);
  iVar3 = 1;
  if (1 < (long)__nmemb) {
    __s2 = *a;
    iVar1 = p->nWords;
    iVar3 = 1;
    sVar4 = 1;
    do {
      __s1 = a[sVar4];
      iVar2 = bcmp(__s1,__s2,(long)iVar1 << 3);
      if (iVar2 != 0) {
        a[iVar3] = __s1;
        __s2 = a[sVar4];
        iVar3 = iVar3 + 1;
      }
      sVar4 = sVar4 + 1;
    } while (__nmemb != sVar4);
  }
  p->nFuncs = iVar3;
  return;
}

Assistant:

void sortAndUnique(word** a, Abc_TtStore_t* p)
{
     int i, count=1, WordsPtrN = p->nFuncs;
     word* tempWordPtr;
     qsort(a,WordsPtrN,sizeof(word*),(int(*)(const void *,const void *))compareWords3);
     tempWordPtr = a[0];
     for(i=1;i<WordsPtrN;i++)   
         if(memcmp(a[i],tempWordPtr,sizeof(word)*(p->nWords)) != 0)
         {
             a[count] = a[i];
             tempWordPtr = a[i];
             count++;
         }
         p->nFuncs = count;
}